

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O0

void __thiscall hwnet::TCPSocket::linklist::~linklist(linklist *this)

{
  linklist *this_local;
  
  clear(this);
  return;
}

Assistant:

~linklist(){
			this->clear();
		}